

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

size_t __thiscall V1Transport::GetSendMemoryUsage(V1Transport *this)

{
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_00;
  CSerializedNetMsg *in_RDI;
  long in_FS_OFFSET;
  AnnotatedMixin<std::mutex> *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_00000008;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock42;
  Mutex *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffeb;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  char *pszName;
  
  pszName = *(char **)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_RDI,in_stack_ffffffffffffffd0,
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(Mutex *)0xffb494);
  MaybeCheckNotHeld(in_stack_ffffffffffffffc8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_00000008,unaff_retaddr,pszName,in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec,(bool)in_stack_ffffffffffffffeb);
  this_00 = (UniqueLock<AnnotatedMixin<std::mutex>_> *)CSerializedNetMsg::GetMemoryUsage(in_RDI);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock(this_00);
  if (*(char **)(in_FS_OFFSET + 0x28) == pszName) {
    return (size_t)this_00;
  }
  __stack_chk_fail();
}

Assistant:

size_t V1Transport::GetSendMemoryUsage() const noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    // Don't count sending-side fields besides m_message_to_send, as they're all small and bounded.
    return m_message_to_send.GetMemoryUsage();
}